

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall
ON_TextureMapping::EvaluateBoxMapping
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  uint i;
  double dVar6;
  double dVar7;
  ON_3dVector n;
  ON_3dPoint local_b8;
  double local_a0;
  ON_3dVector local_98;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  ON_Xform::operator*(&local_b8,&this->m_Pxyz,P);
  ON_Xform::operator*(&local_98,&this->m_Nxyz,N);
  ON_3dVector::Unitize(&local_98);
  local_80 = 0.0;
  if (this->m_projection == ray_projection) {
    if (this->m_bCapped == false) {
      iVar2 = IntersectBoxRayHelper(&local_b8,&local_98,0,&local_a0);
LAB_004d935b:
      uStack_70 = 0;
      local_78 = local_a0;
      iVar3 = IntersectBoxRayHelper(&local_b8,&local_98,1,&local_a0);
      if (iVar2 != 0) goto LAB_004d9383;
LAB_004d93cf:
      iVar2 = iVar3;
      dVar6 = local_a0;
      if (iVar2 == 0) goto LAB_004d941a;
    }
    else {
      iVar1 = IntersectBoxRayHelper(&local_b8,&local_98,2,&local_80);
      iVar2 = IntersectBoxRayHelper(&local_b8,&local_98,0,&local_a0);
      if (((iVar1 == 0) || (local_80 < 0.0 && local_80 < local_a0)) ||
         (0.0 <= local_a0 && local_a0 < local_80)) goto LAB_004d935b;
      local_78 = local_80;
      uStack_70 = 0;
      iVar3 = IntersectBoxRayHelper(&local_b8,&local_98,1,&local_a0);
      iVar2 = iVar1;
LAB_004d9383:
      if ((local_78 < 0.0 && local_78 < local_a0) ||
         (dVar6 = local_78, 0.0 <= local_a0 && local_a0 < local_78)) goto LAB_004d93cf;
    }
    ::operator*(&local_48,dVar6,&local_98);
    ON_3dPoint::operator+(&local_60,&local_b8,&local_48);
    local_b8.z = local_60.z;
    local_b8.x = local_60.x;
    local_b8.y = local_60.y;
  }
  else {
LAB_004d941a:
    uVar5 = (ulong)(ABS(local_b8.x) < ABS(local_b8.y));
    if ((this->m_bCapped == true) &&
       (ABS((&local_b8.x)[ABS(local_b8.x) < ABS(local_b8.y)]) < ABS(local_b8.z))) {
      uVar5 = 2;
    }
    iVar2 = (int)uVar5 * 2 + 2;
    if ((&local_b8.x)[uVar5] <= 0.0 && (&local_b8.x)[uVar5] != 0.0) {
      iVar2 = (int)uVar5 * 2 + 1;
    }
    i = (uint)(ABS(local_98.x) < ABS(local_98.y));
    if ((this->m_bCapped != false) &&
       (ABS((&local_98.x)[ABS(local_98.x) < ABS(local_98.y)]) < ABS(local_98.z))) {
      i = 2;
    }
    pdVar4 = ON_3dVector::operator[](&local_98,i);
    dVar6 = *pdVar4;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      if (0.0 <= dVar6) {
        if (0.0 < dVar6) {
          iVar2 = i * 2 + 2;
        }
      }
      else {
        iVar2 = i * 2 + 1;
      }
    }
  }
  dVar6 = 0.0;
  switch(iVar2) {
  case 1:
    local_b8.x = -local_b8.y;
    local_b8.y = local_b8.z;
    dVar6 = 3.0;
    break;
  case 2:
    local_b8.x = local_b8.y;
    local_b8.y = local_b8.z;
    dVar6 = 1.0;
    break;
  case 3:
    local_b8.y = local_b8.z;
    break;
  case 4:
    local_b8.x = -local_b8.x;
    local_b8.y = local_b8.z;
    dVar6 = 2.0;
    break;
  case 5:
    local_b8.x = -local_b8.x;
    dVar6 = 4.0;
    break;
  case 6:
    dVar6 = 5.0;
  }
  local_b8.x = local_b8.x * 0.5 + 0.5;
  local_b8.y = local_b8.y * 0.5 + 0.5;
  local_b8.z = 0.0;
  if (this->m_texture_space == divided) {
    if (this->m_bCapped == false) {
      dVar7 = 4.0;
    }
    else {
      dVar7 = 6.0;
    }
    local_b8.x = (dVar6 + local_b8.x) / dVar7;
  }
  ON_Xform::operator*(&local_60,&this->m_uvw,&local_b8);
  T->z = local_60.z;
  T->x = local_60.x;
  T->y = local_60.y;
  return iVar2;
}

Assistant:

int ON_TextureMapping::EvaluateBoxMapping(
										   const ON_3dPoint& P,
										   const ON_3dVector& N,
										   ON_3dPoint* T
										   ) const
{
  // The matrix m_Pxyz transforms the world coordinate
  // "mapping cylinder" into the cylinder centered at
  // rst = (0,0,0) with radius 1.0.  The axis runs
  // from rst = (0,0,-1) to rst = (0,0,+1).

  ON_3dPoint rst(m_Pxyz*P);

	ON_3dVector n(m_Nxyz*N);
  n.Unitize();

	int side0, side1;
	double t0, t1;

	side0 = 0;
	t0 = 0.0;

  // side flag
  //  1 =  left side (x=-1)
  //  2 =  right side (x=+1)
  //  3 =  back side (y=-1)
  //  4 =  front side (y=+1)
  //  5 =  bottom side (z=-1)
  //  6 =  top side (z=+1)

  if ( ON_TextureMapping::PROJECTION::ray_projection == m_projection )
	{

		if ( m_bCapped )
		{
			// intersect ray with top and bottom
			side0 = IntersectBoxRayHelper(rst,n,2,&t0);
		}
		// intersect ray with front and back
		side1 = IntersectBoxRayHelper(rst,n,0,&t1);
		if ( 0 == side0 || 1 == BestHitHelper(t0,t1) )
		{
			side0 = side1;
			t0 = t1;
		}
		// intersect ray with left and right
		side1 = IntersectBoxRayHelper(rst,n,1,&t1);
		if ( 0 == side0 || 1 == BestHitHelper(t0,t1) )
		{
			side0 = side1;
			t0 = t1;
		}
		if ( 0 != side0 )
		{
			// ray hit the box
			rst = rst + t0*n;
		}
	}

  if ( 0 == side0 )
  {
    // set side0 = side closest to the point
    side1 = (fabs(rst.x) >= fabs(rst.y)) ? 0 : 1;
    if ( m_bCapped && fabs(rst.z) > fabs(((double*)&rst.x)[side1]) )
      side1 = 2;
    t1 = (&rst.x)[side1];
    if ( t1 < 0.0 )
    {
      side0 = 2*side1 + 1;
    }
    else
    {
      side0 = 2*side1 + 2;
    }

    //if ( fabs(t1) <= 1.0+ON_SQRT_EPSILON )...
    //// The point is inside the box.  If the normal
    //// is not zero, then use it to choose the side
    //// used for the closest point projection.

    side1 = ( fabs(n.x) >= fabs(n.y) ) ? 0 : 1;
    if ( m_bCapped && fabs(n.z) > fabs((&n.x)[side1]))
    {
      side1 = 2;
    }
    t1 = n[side1];
    if ( 0.0 != t1 )
    {
      if ( t1 < 0.0 )
        side0 = 2*side1 + 1;
      else if ( t1 > 0.0 )
        side0 = 2*side1 + 2;
    }
  }

	double shift = 0.0;

  // side flag
  //  1 =  left side (x=-1)
  //  2 =  right side (x=+1)
  //  3 =  back side (y=-1)
  //  4 =  front side (y=+1)
  //  5 =  bottom side (z=-1)
  //  6 =  top side (z=+1)

	switch(side0)
	{
	case 1: // x = -1
		rst.x = -rst.y;
		rst.y =  rst.z;
		shift =  3.0;
		break;
	case 2: // x = +1
		rst.x =  rst.y;
		rst.y =  rst.z;
		shift =  1.0;
		break;
	case 3: // y = -1
		rst.y =  rst.z;
		shift =  0.0;
		break;
	case 4: // y = +1
		rst.x = -rst.x;
		rst.y =  rst.z;
		shift =  2.0;
		break;
	case 5: // z = -1
		rst.x = -rst.x;
		shift =  4.0;
		break;
	case 6: // z = +1
		shift =  5.0;
		break;
	}

  // normalize texture coordinates
  rst.x = 0.5*rst.x + 0.5;
  rst.y = 0.5*rst.y + 0.5;
	rst.z = 0.0;

	if( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space)
	{
    rst.x = (shift + rst.x)/(m_bCapped ? 6.0 : 4.0);
	}

	*T = m_uvw*rst;

  return side0;
}